

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O0

void __thiscall DRAG<UF>::PerformLabeling(DRAG<UF> *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  uint uVar10;
  bool bVar11;
  int iLabel_3;
  int iLabel_2;
  int c_2;
  uint *img_labels_row_2;
  uchar *img_row_2;
  int iLabel_1;
  int iLabel;
  int c_1;
  uint *img_labels_row_fol;
  uint *img_labels_row_1;
  uchar *img_row_fol_1;
  uchar *img_row_1;
  int r;
  bool o_cols;
  int e_cols;
  int iStack_c4;
  bool o_rows;
  int e_rows;
  int c;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row;
  int r_1;
  Size local_80;
  Mat_<int> local_78;
  int local_18;
  int local_14;
  int w;
  int h;
  DRAG<UF> *this_local;
  
  local_14 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  local_18 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  _w = this;
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  UF::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) / 2
            ) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc + 1)
                / 2) + 1);
  UF::Setup();
  img_row._0_4_ = 0;
  do {
    if (local_14 <= (int)img_row) {
      uVar6 = UF::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
      uVar6 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      uVar10 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc
               & 0xfffffffe;
      bVar11 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc
               % 2 == 1;
      for (img_row_1._0_4_ = 0; (int)img_row_1 < (int)(uVar6 & 0xfffffffe);
          img_row_1._0_4_ = (int)img_row_1 + 2) {
        puVar8 = cv::Mat::ptr<unsigned_char>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                            (int)img_row_1);
        lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
        puVar9 = cv::Mat::ptr<unsigned_int>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                             super_Mat,(int)img_row_1);
        lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            field_0x48;
        for (iLabel_1 = 0; iLabel_1 < (int)uVar10; iLabel_1 = iLabel_1 + 2) {
          if ((int)puVar9[iLabel_1] < 1) {
            puVar9[iLabel_1] = 0;
            puVar9[iLabel_1 + 1] = 0;
            *(undefined4 *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = 0;
            *(undefined4 *)((long)puVar9 + (long)(iLabel_1 + 1) * 4 + lVar3) = 0;
          }
          else {
            uVar7 = UF::GetLabel(puVar9[iLabel_1]);
            if (puVar8[iLabel_1] == '\0') {
              puVar9[iLabel_1] = 0;
            }
            else {
              puVar9[iLabel_1] = uVar7;
            }
            if (puVar8[iLabel_1 + 1] == '\0') {
              puVar9[iLabel_1 + 1] = 0;
            }
            else {
              puVar9[iLabel_1 + 1] = uVar7;
            }
            if (puVar8[iLabel_1 + lVar2] == '\0') {
              *(undefined4 *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = 0;
            }
            else {
              *(uint *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = uVar7;
            }
            if (puVar8[(iLabel_1 + 1) + lVar2] == '\0') {
              *(undefined4 *)((long)puVar9 + (long)(iLabel_1 + 1) * 4 + lVar3) = 0;
            }
            else {
              *(uint *)((long)puVar9 + (long)(iLabel_1 + 1) * 4 + lVar3) = uVar7;
            }
          }
        }
        if (bVar11) {
          if ((int)puVar9[iLabel_1] < 1) {
            puVar9[iLabel_1] = 0;
            *(undefined4 *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = 0;
          }
          else {
            uVar7 = UF::GetLabel(puVar9[iLabel_1]);
            if (puVar8[iLabel_1] == '\0') {
              puVar9[iLabel_1] = 0;
            }
            else {
              puVar9[iLabel_1] = uVar7;
            }
            if (puVar8[iLabel_1 + lVar2] == '\0') {
              *(undefined4 *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = 0;
            }
            else {
              *(uint *)((long)puVar9 + (long)iLabel_1 * 4 + lVar3) = uVar7;
            }
          }
        }
      }
      if (iVar1 % 2 == 1) {
        puVar8 = cv::Mat::ptr<unsigned_char>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                            (int)img_row_1);
        puVar9 = cv::Mat::ptr<unsigned_int>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                             super_Mat,(int)img_row_1);
        for (iLabel_3 = 0; iLabel_3 < (int)uVar10; iLabel_3 = iLabel_3 + 2) {
          if ((int)puVar9[iLabel_3] < 1) {
            puVar9[iLabel_3] = 0;
            puVar9[iLabel_3 + 1] = 0;
          }
          else {
            uVar6 = UF::GetLabel(puVar9[iLabel_3]);
            if (puVar8[iLabel_3] == '\0') {
              puVar9[iLabel_3] = 0;
            }
            else {
              puVar9[iLabel_3] = uVar6;
            }
            if (puVar8[iLabel_3 + 1] == '\0') {
              puVar9[iLabel_3 + 1] = 0;
            }
            else {
              puVar9[iLabel_3 + 1] = uVar6;
            }
          }
        }
        if (bVar11) {
          if ((int)puVar9[iLabel_3] < 1) {
            puVar9[iLabel_3] = 0;
          }
          else {
            uVar6 = UF::GetLabel(puVar9[iLabel_3]);
            if (puVar8[iLabel_3] == '\0') {
              puVar9[iLabel_3] = 0;
            }
            else {
              puVar9[iLabel_3] = uVar6;
            }
          }
        }
      }
      UF::Dealloc();
      return;
    }
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
            lVar2;
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row);
    lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                         field_0x48 -
            **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iStack_c4 = 0; iStack_c4 < local_18; iStack_c4 = iStack_c4 + 2) {
      if (puVar8[iStack_c4] == '\0') {
        if (((int)img_row + 1 < local_14) && (puVar8[iStack_c4 + lVar3] != '\0')) {
          if ((iStack_c4 + 1 < local_18) && (puVar8[iStack_c4 + 1] != '\0')) {
            if ((-1 < iStack_c4 + -1) && (puVar8[iStack_c4 + -1] != '\0')) {
              if ((local_18 <= iStack_c4 + 1) ||
                 (((int)img_row + -1 < 0 || (puVar8[(iStack_c4 + 1) - lVar2] == '\0'))))
              goto LAB_0011fa7f;
              goto LAB_0011f7d9;
            }
            if ((iStack_c4 + -1 < 0) ||
               ((local_14 <= (int)img_row + 1 || (puVar8[(iStack_c4 + -1) + lVar3] == '\0'))))
            goto LAB_00121096;
            if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -1)) &&
               (puVar8[(iStack_c4 + 1) - lVar2] != '\0')) {
LAB_00120d49:
              if ((-1 < iStack_c4 + -2) && (puVar8[iStack_c4 + -2] != '\0')) goto LAB_0011fc5d;
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
            else if (((iStack_c4 + 2 < local_18) && (-1 < (int)img_row + -1)) &&
                    (puVar8[(iStack_c4 + 2) - lVar2] != '\0')) {
              if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
                 (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_00120d49;
              if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5),
                                  puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else if ((iStack_c4 + -2 < 0) || (puVar8[iStack_c4 + -2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else {
                if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
                   (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) goto LAB_00120236;
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
            }
            else if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
            }
            else {
              if ((-1 < iStack_c4 + -2) && (puVar8[iStack_c4 + -2] != '\0')) goto LAB_0011f871;
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
          }
          else if ((iStack_c4 + -1 < 0) ||
                  ((local_14 <= (int)img_row + 1 || (puVar8[(iStack_c4 + -1) + lVar3] == '\0')))) {
            if ((iStack_c4 + -1 < 0) || (puVar8[iStack_c4 + -1] == '\0')) {
              uVar6 = UF::NewLabel();
              puVar9[iStack_c4] = uVar6;
            }
            else {
              puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
            }
          }
          else {
            puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
          }
        }
        else if ((iStack_c4 + 1 < local_18) && (puVar8[iStack_c4 + 1] != '\0')) {
LAB_00121096:
          if ((iStack_c4 + 1 < local_18) &&
             ((-1 < (int)img_row + -1 && (puVar8[(iStack_c4 + 1) - lVar2] != '\0')))) {
            puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
          }
          else if ((iStack_c4 + 2 < local_18) &&
                  ((-1 < (int)img_row + -1 && (puVar8[(iStack_c4 + 2) - lVar2] != '\0')))) {
            if ((-1 < (int)img_row + -1) && (puVar8[iStack_c4 - lVar2] != '\0')) goto LAB_0012098b;
            puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5);
          }
          else if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
            uVar6 = UF::NewLabel();
            puVar9[iStack_c4] = uVar6;
          }
          else {
            puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
          }
        }
        else if (((iStack_c4 + 1 < local_18) && ((int)img_row + 1 < local_14)) &&
                (puVar8[(iStack_c4 + 1) + lVar3] != '\0')) {
          uVar6 = UF::NewLabel();
          puVar9[iStack_c4] = uVar6;
        }
        else {
          puVar9[iStack_c4] = 0;
        }
      }
      else if ((iStack_c4 + -1 < 0) || (puVar8[iStack_c4 + -1] == '\0')) {
        if ((iStack_c4 + -1 < 0) ||
           ((local_14 <= (int)img_row + 1 || (puVar8[(iStack_c4 + -1) + lVar3] == '\0')))) {
          if ((iStack_c4 + 1 < local_18) &&
             ((-1 < (int)img_row + -1 && (puVar8[(iStack_c4 + 1) - lVar2] != '\0')))) {
            if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              if ((iStack_c4 + -1 < 0) ||
                 (((int)img_row + -1 < 0 || (puVar8[(iStack_c4 + -1) - lVar2] == '\0')))) {
                puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
              }
              else {
LAB_0011fcf6:
                if (((int)img_row + -2 < 0) || (puVar8[iStack_c4 + lVar4] == '\0')) {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                    *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5));
                  puVar9[iStack_c4] = uVar6;
                }
                else {
                  puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
                }
              }
            }
            else {
              puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
            }
          }
          else if ((iStack_c4 + 1 < local_18) &&
                  ((((puVar8[iStack_c4 + 1] != '\0' && (iStack_c4 + 2 < local_18)) &&
                    (-1 < (int)img_row + -1)) && (puVar8[(iStack_c4 + 2) - lVar2] != '\0')))) {
            if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              if ((iStack_c4 + -1 < 0) ||
                 (((int)img_row + -1 < 0 || (puVar8[(iStack_c4 + -1) - lVar2] == '\0')))) {
                puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5);
              }
              else {
                if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
                   (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_0011fcf6;
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
            }
            else {
LAB_0012098b:
              if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
                 (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) {
                puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
              }
              else {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
            }
          }
          else if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
            if ((iStack_c4 + -1 < 0) ||
               (((int)img_row + -1 < 0 || (puVar8[(iStack_c4 + -1) - lVar2] == '\0')))) {
              uVar6 = UF::NewLabel();
              puVar9[iStack_c4] = uVar6;
            }
            else {
              puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
            }
          }
          else {
            puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
          }
        }
        else if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -1)) &&
                (puVar8[(iStack_c4 + 1) - lVar2] != '\0')) {
          if ((iStack_c4 + -2 < 0) || (puVar8[iStack_c4 + -2] == '\0')) {
            if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
                 (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else {
LAB_0011ff45:
                if (((int)img_row + -2 < 0) || (puVar8[iStack_c4 + lVar4] == '\0')) {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                    *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5));
                  uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
                  puVar9[iStack_c4] = uVar6;
                }
                else {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                    puVar9[iStack_c4 + -2]);
                  puVar9[iStack_c4] = uVar6;
                }
              }
            }
            else {
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
          }
          else {
LAB_0011fc5d:
            if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
               (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) {
LAB_0011fd8d:
              if (((iStack_c4 + -2 < 0) || ((int)img_row + -1 < 0)) ||
                 (puVar8[(iStack_c4 + -2) - lVar2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else {
                if (((-1 < iStack_c4 + -1) && (-1 < (int)img_row + -2)) &&
                   (puVar8[(iStack_c4 + -1) + lVar4] != '\0')) goto LAB_0011fca3;
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
            }
            else {
LAB_0011fca3:
              if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) goto LAB_0011fcf6;
              puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
            }
          }
        }
        else if (((iStack_c4 + 1 < local_18) && (puVar8[iStack_c4 + 1] != '\0')) &&
                ((iStack_c4 + 2 < local_18 &&
                 ((-1 < (int)img_row + -1 && (puVar8[(iStack_c4 + 2) - lVar2] != '\0')))))) {
          if ((iStack_c4 + -2 < 0) || (puVar8[iStack_c4 + -2] == '\0')) {
            if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              if ((iStack_c4 + -1 < 0) ||
                 (((int)img_row + -1 < 0 || (puVar8[(iStack_c4 + -1) - lVar2] == '\0')))) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5),
                                  puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else {
                if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
                   (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_0011ff45;
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
            }
            else if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
                    (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) {
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
            else {
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
              uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
          }
          else if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
                  (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) {
            if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
               (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_0011fd8d;
            if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5),
                                puVar9[iStack_c4 + -2]);
              puVar9[iStack_c4] = uVar6;
            }
            else {
LAB_00120236:
              if (((iStack_c4 + -2 < 0) || ((int)img_row + -1 < 0)) ||
                 (puVar8[(iStack_c4 + -2) - lVar2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else if (((iStack_c4 + -1 < 0) || ((int)img_row + -2 < 0)) ||
                      (puVar8[(iStack_c4 + -1) + lVar4] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                uVar6 = UF::Merge(uVar6,puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
            }
          }
          else {
            if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
               (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_0011fca3;
            uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                              *(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5));
            puVar9[iStack_c4] = uVar6;
          }
        }
        else if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
                (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) {
          if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
            puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
          }
          else {
            if ((-1 < iStack_c4 + -2) && (puVar8[iStack_c4 + -2] != '\0')) goto LAB_0011f8d7;
            uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                              puVar9[iStack_c4 + -2]);
            puVar9[iStack_c4] = uVar6;
          }
        }
        else if ((iStack_c4 + -2 < 0) || (puVar8[iStack_c4 + -2] == '\0')) {
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                            puVar9[iStack_c4 + -2]);
          puVar9[iStack_c4] = uVar6;
        }
        else {
          puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
        }
      }
      else if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -1)) &&
              (puVar8[(iStack_c4 + 1) - lVar2] != '\0')) {
LAB_0011f7d9:
        if (((int)img_row + -1 < 0) || (puVar8[iStack_c4 - lVar2] == '\0')) {
          if (((int)img_row + -2 < 0) || (puVar8[iStack_c4 + lVar4] == '\0')) {
            uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                              puVar9[iStack_c4 + -2]);
            puVar9[iStack_c4] = uVar6;
          }
          else {
LAB_0011f871:
            if (((iStack_c4 + -1 < 0) || ((int)img_row + -1 < 0)) ||
               (puVar8[(iStack_c4 + -1) - lVar2] == '\0')) {
LAB_0011f8d7:
              if (((iStack_c4 + -2 < 0) || ((int)img_row + -1 < 0)) ||
                 (puVar8[(iStack_c4 + -2) - lVar2] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5),
                                  puVar9[iStack_c4 + -2]);
                puVar9[iStack_c4] = uVar6;
              }
              else if (((iStack_c4 + -1 < 0) || ((int)img_row + -2 < 0)) ||
                      (puVar8[(iStack_c4 + -1) + lVar4] == '\0')) {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5),
                                  *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5));
                puVar9[iStack_c4] = uVar6;
              }
              else {
                puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
              }
            }
            else {
              puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)(iStack_c4 + -2) * 4 + lVar5);
            }
          }
        }
        else {
          puVar9[iStack_c4] = *(uint *)((long)puVar9 + (long)iStack_c4 * 4 + lVar5);
        }
      }
      else if ((iStack_c4 + 1 < local_18) && (puVar8[iStack_c4 + 1] != '\0')) {
LAB_0011fa7f:
        if (((iStack_c4 + 2 < local_18) && (-1 < (int)img_row + -1)) &&
           (puVar8[(iStack_c4 + 2) - lVar2] != '\0')) {
          if (((iStack_c4 + 1 < local_18) && (-1 < (int)img_row + -2)) &&
             (puVar8[(iStack_c4 + 1) + lVar4] != '\0')) goto LAB_0011f7d9;
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(iStack_c4 + 2) * 4 + lVar5),
                            puVar9[iStack_c4 + -2]);
          puVar9[iStack_c4] = uVar6;
        }
        else {
          puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
        }
      }
      else {
        puVar9[iStack_c4] = puVar9[iStack_c4 + -2];
      }
    }
    img_row._0_4_ = (int)img_row + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }